

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_parser_parser.cpp
# Opt level: O3

vector<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
* duckdb_libpgquery::tokenize
            (vector<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
             *__return_storage_ptr__,char *str)

{
  pointer *ppPVar1;
  iterator __position;
  PGSimplifiedToken PVar2;
  int iVar3;
  core_yyscan_t yyscanner;
  PGSimplifiedToken current_token;
  int loc;
  YYSTYPE type;
  base_yy_extra_type yyextra;
  PGSimplifiedToken local_c8;
  int32_t local_bc;
  YYSTYPE local_b8;
  core_yy_extra_type local_b0;
  undefined1 local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  yyscanner = scanner_init(str,&local_b0,(PGScanKeyword *)&ScanKeywords,0x1e3);
  local_60 = 0;
  do {
    iVar3 = base_yylex(&local_b8,&local_bc,yyscanner);
    if (iVar3 == 0) {
      scanner_finish(yyscanner);
      return __return_storage_ptr__;
    }
    switch(iVar3) {
    case 0x102:
      local_c8._0_4_ = (uint)(uint3)local_c8._1_3_ << 8;
      break;
    case 0x103:
    case 0x108:
      local_c8.type = 1;
      break;
    case 0x104:
    case 0x105:
    case 0x106:
      local_c8.type = 2;
      break;
    case 0x107:
    case 0x109:
    case 0x10c:
    case 0x10d:
    case 0x112:
    case 0x113:
    case 0x114:
switchD_01c871c8_caseD_107:
      local_c8.type = 3;
      break;
    default:
      if (iVar3 < 0xff) goto switchD_01c871c8_caseD_107;
      local_c8.type = 4;
    }
    local_c8.start = local_bc;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<duckdb_libpgquery::PGSimplifiedToken,std::allocator<duckdb_libpgquery::PGSimplifiedToken>>
      ::_M_realloc_insert<duckdb_libpgquery::PGSimplifiedToken_const&>
                ((vector<duckdb_libpgquery::PGSimplifiedToken,std::allocator<duckdb_libpgquery::PGSimplifiedToken>>
                  *)__return_storage_ptr__,__position,&local_c8);
    }
    else {
      PVar2.start = local_bc;
      PVar2.type = local_c8.type;
      PVar2._1_3_ = local_c8._1_3_;
      *__position._M_current = PVar2;
      ppPVar1 = &(__return_storage_ptr__->
                 super__Vector_base<duckdb_libpgquery::PGSimplifiedToken,_std::allocator<duckdb_libpgquery::PGSimplifiedToken>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
  } while( true );
}

Assistant:

std::vector<PGSimplifiedToken> tokenize(const char *str) {
	core_yyscan_t yyscanner;
	base_yy_extra_type yyextra;

	std::vector<PGSimplifiedToken> result;
	yyscanner = scanner_init(str, &yyextra.core_yy_extra, ScanKeywords, NumScanKeywords);
	yyextra.have_lookahead = false;

	while(true) {
		YYSTYPE type;
		YYLTYPE loc;
		int token;
		try {
			token = base_yylex(&type, &loc, yyscanner);
		} catch(...) {
			token = 0;
		}
		if (token == 0) {
			break;
		}
		PGSimplifiedToken current_token;
		switch(token) {
		case IDENT:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_IDENTIFIER;
			break;
		case ICONST:
		case FCONST:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_NUMERIC_CONSTANT;
			break;
		case SCONST:
		case BCONST:
		case XCONST:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_STRING_CONSTANT;
			break;
		case Op:
		case PARAM:
		case COLON_EQUALS:
		case EQUALS_GREATER:
		case LESS_EQUALS:
		case GREATER_EQUALS:
		case NOT_EQUALS:
			current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_OPERATOR;
			break;
		default:
			if (token >= 255) {
				// non-ascii value, probably a keyword
				current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_KEYWORD;
			} else {
				// ascii value, probably an operator
				current_token.type = PGSimplifiedTokenType::PG_SIMPLIFIED_TOKEN_OPERATOR;
			}
			break;
		}
		current_token.start = loc;
		result.push_back(current_token);
	}

	scanner_finish(yyscanner);
	return result;
}